

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.h
# Opt level: O2

void __thiscall
embree::CommandLineParser::
CommandLineOptionClosure<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/common/tutorial/tutorial.cpp:150:25)>
::parse(CommandLineOptionClosure<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_common_tutorial_tutorial_cpp:150:25)>
        *this,Ref<embree::ParseStream> *cin,FileName *path)

{
  ParseStream *this_00;
  TutorialApplication *this_01;
  ParseStream *this_02;
  LineCommentFilter *this_03;
  allocator local_e3;
  allocator local_e2;
  allocator local_e1;
  Ref<embree::Stream<int>_> local_e0;
  Ref<embree::ParseStream> local_d8;
  string local_d0;
  FileName file;
  FileName local_90;
  string local_70;
  string local_50;
  
  this_00 = cin->ptr;
  if (this_00 != (ParseStream *)0x0) {
    (*(this_00->
      super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).super_RefCount._vptr_RefCount[2])(this_00);
  }
  this_01 = (this->f).this;
  ParseStream::getFileName((FileName *)&local_d0,this_00);
  FileName::operator+(&file,path,(FileName *)&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  this_02 = (ParseStream *)::operator_new(0x48);
  this_03 = (LineCommentFilter *)::operator_new(0x68);
  std::__cxx11::string::string((string *)&local_d0,"#",&local_e1);
  LineCommentFilter::LineCommentFilter(this_03,&file,&local_d0);
  local_e0.ptr = (Stream<int> *)this_03;
  (*(this_03->super_Stream<int>).super_RefCount._vptr_RefCount[2])(this_03);
  std::__cxx11::string::string((string *)&local_50,"\n\t\r ",&local_e2);
  std::__cxx11::string::string((string *)&local_70,"",&local_e3);
  ParseStream::ParseStream(this_02,&local_e0,&local_50,&local_70,false);
  local_d8.ptr = this_02;
  (*(this_02->
    super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
    super_RefCount._vptr_RefCount[2])(this_02);
  FileName::path(&local_90,&file);
  Application::parseCommandLine(&this_01->super_Application,&local_d8,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  if (local_d8.ptr != (ParseStream *)0x0) {
    (*((local_d8.ptr)->
      super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).super_RefCount._vptr_RefCount[3])();
  }
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  if ((LineCommentFilter *)local_e0.ptr != (LineCommentFilter *)0x0) {
    (*(((Stream<int> *)&(local_e0.ptr)->super_RefCount)->super_RefCount)._vptr_RefCount[3])();
  }
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&file);
  (*(this_00->
    super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
    super_RefCount._vptr_RefCount[3])(this_00);
  return;
}

Assistant:

virtual void parse(Ref<ParseStream> cin, const FileName& path) {
        f(cin,path);
      }